

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nearest_neighbor.cc
# Opt level: O3

void __thiscall
features::NearestNeighbor<unsigned_short>::find
          (NearestNeighbor<unsigned_short> *this,unsigned_short *query,Result *result)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  short *psVar6;
  int iVar7;
  int iVar8;
  unsigned_short *puVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  
  result->index_2nd_best = 0;
  result->dist_1st_best = 0;
  result->dist_2nd_best = 0;
  result->index_1st_best = 0;
  iVar1 = *(int *)this;
  iVar2 = *(int *)(this + 4);
  iVar3 = iVar1 + 7;
  if (-1 < iVar1) {
    iVar3 = iVar1;
  }
  if (iVar2 < 1) {
    uVar13 = 0;
    uVar14 = 0;
  }
  else {
    psVar6 = *(short **)(this + 8);
    iVar8 = 0;
    uVar5 = 0;
    iVar7 = 0;
    uVar4 = 0;
    do {
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0;
      uVar16 = 0;
      uVar17 = 0;
      uVar18 = 0;
      uVar19 = 0;
      uVar20 = 0;
      puVar9 = query;
      iVar10 = iVar3 >> 3;
      if (7 < iVar1) {
        do {
          uVar13 = uVar13 + *psVar6 * *puVar9;
          uVar14 = uVar14 + psVar6[1] * puVar9[1];
          uVar15 = uVar15 + psVar6[2] * puVar9[2];
          uVar16 = uVar16 + psVar6[3] * puVar9[3];
          uVar17 = uVar17 + psVar6[4] * puVar9[4];
          uVar18 = uVar18 + psVar6[5] * puVar9[5];
          uVar19 = uVar19 + psVar6[6] * puVar9[6];
          uVar20 = uVar20 + psVar6[7] * puVar9[7];
          psVar6 = psVar6 + 8;
          iVar10 = iVar10 + -1;
          puVar9 = puVar9 + 8;
        } while (iVar10 != 0);
      }
      uVar11 = (uint)uVar20 +
               (uint)uVar19 + (uint)uVar18 + (uint)uVar17 +
               (uint)uVar16 + (uint)uVar15 + (uint)uVar14 + (uint)uVar13;
      uVar12 = uVar4;
      if ((uVar5 & 0xffff) <= uVar11) {
        if (uVar11 < (uVar4 & 0xffff)) {
          result->index_2nd_best = iVar7;
          result->dist_2nd_best = (unsigned_short)uVar11;
          uVar5 = uVar11;
        }
        else {
          result->index_2nd_best = iVar8;
          result->dist_2nd_best = (unsigned_short)uVar4;
          result->index_1st_best = iVar7;
          result->dist_1st_best = (unsigned_short)uVar11;
          uVar12 = uVar11;
          iVar8 = iVar7;
          uVar5 = uVar4;
        }
      }
      uVar14 = (ushort)uVar12;
      uVar13 = (ushort)uVar5;
      iVar7 = iVar7 + 1;
      uVar4 = uVar12;
    } while (iVar7 != iVar2);
  }
  uVar15 = -uVar14 - 0x1ff;
  if (0xfe01 < uVar14) {
    uVar15 = 0;
  }
  uVar14 = -uVar13 - 0x1ff;
  if (0xfe01 < uVar13) {
    uVar14 = 0;
  }
  if (0x7ffe < uVar15) {
    uVar15 = 0x7fff;
  }
  result->dist_1st_best = uVar15 * 2;
  if (0x7ffe < uVar14) {
    uVar14 = 0x7fff;
  }
  result->dist_2nd_best = uVar14 * 2;
  return;
}

Assistant:

void
NearestNeighbor<unsigned short>::find (unsigned short const* query,
    NearestNeighbor<unsigned short>::Result* result) const
{
    /* Result distances are shamelessly misused to store inner products. */
    result->dist_1st_best = 0;
    result->dist_2nd_best = 0;
    result->index_1st_best = 0;
    result->index_2nd_best = 0;

    short_inner_prod<unsigned short>(query, result, this->elements,
        this->num_elements, this->dimensions);

    /*
     * Compute actual square distances.
     * The distance with 'unsigned char' vectors is: 2 * 255^2 - 2 * <Q, Ci>.
     * The maximum distance is (2*255)^2, which unfortunately does not fit
     * in a unsigned short. Therefore, the result distance is clapmed:
     * 2 * 255^2 - 2 * <Q, Ci> = 2 * (255^2 - <Q, Ci>) and (255^2 - <Q, Ci>)
     * is clamped to 32767 and then multiplied by 2.
     */
    result->dist_1st_best = std::min(65025, (int)result->dist_1st_best);
    result->dist_2nd_best = std::min(65025, (int)result->dist_2nd_best);
    result->dist_1st_best = 65025 - result->dist_1st_best;
    result->dist_2nd_best = 65025 - result->dist_2nd_best;
    result->dist_1st_best = std::min(32767, (int)result->dist_1st_best) * 2;
    result->dist_2nd_best = std::min(32767, (int)result->dist_2nd_best) * 2;
}